

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

void __thiscall OutputRedirect::restore(OutputRedirect *this)

{
  int __fd;
  int __fd2;
  
  if ((this->original_).fd_ != -1) {
    flush(this);
    __fd = fileno((FILE *)this->file_);
    fmt::File::dup2(&this->original_,__fd,__fd2);
    fmt::File::close(&this->original_,__fd);
    return;
  }
  return;
}

Assistant:

void OutputRedirect::restore() {
  if (original_.descriptor() == -1)
    return;  // Already restored.
  flush();
  // Restore the original file.
  original_.dup2(FMT_POSIX(fileno(file_)));
  original_.close();
}